

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_ed25519_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  int iVar1;
  undefined1 local_60 [8];
  string_buf buf;
  EVP_PKEY *ctx;
  uchar *key;
  size_t key_len;
  void **abstract_local;
  size_t hostkey_data_len_local;
  uchar *hostkey_data_local;
  LIBSSH2_SESSION *session_local;
  
  buf.len = 0;
  key_len = (size_t)abstract;
  abstract_local = (void **)hostkey_data_len;
  hostkey_data_len_local = (size_t)hostkey_data;
  hostkey_data_local = (uchar *)session;
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_ed25519_dtor(session,abstract);
    *(undefined8 *)key_len = 0;
  }
  if (abstract_local < (void **)0x13) {
    session_local._4_4_ = -1;
  }
  else {
    local_60 = (undefined1  [8])hostkey_data_len_local;
    buf.data = (uchar *)hostkey_data_len_local;
    buf.dataptr = (uchar *)abstract_local;
    iVar1 = _libssh2_match_string((string_buf *)local_60,"ssh-ed25519");
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_string((string_buf *)local_60,(uchar **)&ctx,(size_t *)&key);
      if (iVar1 == 0) {
        iVar1 = _libssh2_eob((string_buf *)local_60);
        if (iVar1 == 0) {
          session_local._4_4_ = -1;
        }
        else {
          iVar1 = _libssh2_ed25519_new_public
                            ((EVP_PKEY **)&buf.len,(LIBSSH2_SESSION *)hostkey_data_local,
                             (uchar *)ctx,(size_t)key);
          if (iVar1 == 0) {
            *(size_t *)key_len = buf.len;
            session_local._4_4_ = 0;
          }
          else {
            session_local._4_4_ = -1;
          }
        }
      }
      else {
        session_local._4_4_ = -1;
      }
    }
    else {
      session_local._4_4_ = -1;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_ed25519_init(LIBSSH2_SESSION * session,
                                const unsigned char *hostkey_data,
                                size_t hostkey_data_len,
                                void **abstract)
{
    size_t key_len;
    unsigned char *key;
    libssh2_ed25519_ctx *ctx = NULL;
    struct string_buf buf;

    if(*abstract) {
        hostkey_method_ssh_ed25519_dtor(session, abstract);
        *abstract = NULL;
    }

    if(hostkey_data_len < 19) {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "host key length too short"));
        return -1;
    }

    buf.data = (unsigned char *)LIBSSH2_UNCONST(hostkey_data);
    buf.dataptr = buf.data;
    buf.len = hostkey_data_len;

    if(_libssh2_match_string(&buf, "ssh-ed25519"))
        return -1;

    /* public key */
    if(_libssh2_get_string(&buf, &key, &key_len))
        return -1;

    if(!_libssh2_eob(&buf))
        return -1;

    if(_libssh2_ed25519_new_public(&ctx, session, key, key_len) != 0) {
        return -1;
    }

    *abstract = ctx;

    return 0;
}